

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtWrenchesAndJointTorquesEstimator.cpp
# Opt level: O0

bool __thiscall
iDynTree::ExtWrenchesAndJointTorquesEstimator::setModel
          (ExtWrenchesAndJointTorquesEstimator *this,Model *_model)

{
  byte bVar1;
  Model *pMVar2;
  size_t nrOfSubModels;
  Model *in_RSI;
  Model *in_RDI;
  bool bVar3;
  bool ok;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ftJointNames;
  SubModelDecomposition *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  
  pMVar2 = in_RDI;
  iDynTree::Model::operator=(in_RDI,in_RSI);
  iDynTree::Model::computeFullTreeTraversal((Traversal *)in_RDI);
  iDynTree::LinkTraversalsCache::resize(in_RDI + 0x1c8);
  iDynTree::JointPosDoubleArray::resize(in_RDI + 0x1e0);
  iDynTree::JointDOFsDoubleArray::resize(in_RDI + 0x200);
  iDynTree::JointDOFsDoubleArray::resize(in_RDI + 0x220);
  iDynTree::LinkVelArray::resize(in_RDI + 0x240);
  iDynTree::LinkAccArray::resize(in_RDI + 600);
  iDynTree::LinkWrenches::resize(in_RDI + 0x288);
  iDynTree::LinkWrenches::resize(in_RDI + 0x270);
  iDynTree::FreeFloatingGeneralizedTorques::resize(in_RDI + 0x2a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x59ce94);
  iDynTree::Model::sensors();
  getFTJointNames((SensorsList *)pMVar2,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_RSI);
  bVar1 = iDynTree::SubModelDecomposition::splitModelAlongJoints
                    (in_RDI + 0x130,(Traversal *)in_RDI,(vector *)(in_RDI + 0x168));
  bVar3 = (bVar1 & 1) != 0;
  if (bVar3) {
    estimateExternalWrenchesBuffers::resize
              ((estimateExternalWrenchesBuffers *)CONCAT17(bVar1,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98);
    pMVar2 = in_RDI + 0x300;
    nrOfSubModels = iDynTree::Model::getNrOfLinks();
    estimateExternalWrenchesBuffers::resize
              ((estimateExternalWrenchesBuffers *)CONCAT17(bVar1,in_stack_ffffffffffffffa0),
               nrOfSubModels,(size_t)pMVar2);
    in_RDI[0x160] = (Model)0x1;
  }
  else {
    iDynTree::reportError
              ("ExtWrenchesAndJointTorquesEstimator","setModelAndSensors",
               "Error in creating submodel decomposition of the model.");
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(bVar1,in_stack_ffffffffffffffa0));
  return bVar3;
}

Assistant:

bool ExtWrenchesAndJointTorquesEstimator::setModel(const Model& _model)
{
    m_model = _model;

    // resize the data structures
    m_model.computeFullTreeTraversal(m_dynamicTraversal);
    m_kinematicTraversals.resize(m_model);

    m_jointPos.resize(m_model);
    m_jointVel.resize(m_model);
    m_jointAcc.resize(m_model);
    m_linkVels.resize(m_model);
    m_linkProperAccs.resize(m_model);
    m_linkIntWrenches.resize(m_model);
    m_linkNetExternalWrenches.resize(m_model);
    m_generalizedTorques.resize(m_model);

    // create submodel structure
    std::vector<std::string> ftJointNames;
    getFTJointNames(m_model.sensors(),ftJointNames);
    bool ok = m_submodels.splitModelAlongJoints(m_model,m_dynamicTraversal,ftJointNames);

    if( !ok )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","setModelAndSensors","Error in creating submodel decomposition of the model.");
        return false;
    }

    m_bufs.resize(m_submodels);
    m_calibBufs.resize(1,_model.getNrOfLinks());

    // set that the model is valid
    m_isModelValid = true;

    return true;
}